

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

RegSlot __thiscall Js::FunctionBody::MapRegSlot(FunctionBody *this,RegSlot reg)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  uint local_14;
  RegSlot reg_local;
  FunctionBody *this_local;
  
  bVar2 = RegIsConst(this,reg);
  if (bVar2) {
    local_14 = -(reg + 2);
    RVar3 = GetConstantCount(this);
    if (RVar3 <= local_14) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0xba4,"(reg < this->GetConstantCount())",
                                  "reg < this->GetConstantCount()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  else {
    RVar3 = GetConstantCount(this);
    local_14 = RVar3 + reg;
  }
  return local_14;
}

Assistant:

RegSlot MapRegSlot(RegSlot reg)
        {
            if (this->RegIsConst(reg))
            {
                reg = CONSTREG_TO_REGSLOT(reg);
                Assert(reg < this->GetConstantCount());
            }
            else
            {
                reg += this->GetConstantCount();
            }

            return reg;
        }